

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O0

int pkey_hkdf_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int *piVar1;
  int iVar2;
  uint8_t *data;
  size_t len;
  CBS *info;
  CBS *salt;
  CBS *key;
  HKDF_PKEY_CTX *hctx;
  void *p2_local;
  int p1_local;
  int type_local;
  EVP_PKEY_CTX *ctx_local;
  
  piVar1 = (int *)ctx->data;
  switch(type) {
  case 0x100e:
    if (((p1 == 0) || (p1 == 1)) || (p1 == 2)) {
      *piVar1 = p1;
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(6,0,0x72,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                    ,0x95);
      ctx_local._4_4_ = 0;
    }
    break;
  case 0x100f:
    *(void **)(piVar1 + 2) = p2;
    ctx_local._4_4_ = 1;
    break;
  case 0x1010:
    iVar2 = CBS_stow((CBS *)p2,(uint8_t **)(piVar1 + 4),(size_t *)(piVar1 + 6));
    if (iVar2 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = 1;
    }
    break;
  case 0x1011:
    iVar2 = CBS_stow((CBS *)p2,(uint8_t **)(piVar1 + 8),(size_t *)(piVar1 + 10));
    if (iVar2 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = 1;
    }
    break;
  case 0x1012:
    data = CBS_data((CBS *)p2);
    len = CBS_len((CBS *)p2);
    iVar2 = CBB_add_bytes((CBB *)(piVar1 + 0xc),data,len);
    if (iVar2 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = 1;
    }
    break;
  default:
    ERR_put_error(6,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                  ,0xb5);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_hkdf_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  HKDF_PKEY_CTX *hctx = reinterpret_cast<HKDF_PKEY_CTX *>(ctx->data);
  switch (type) {
    case EVP_PKEY_CTRL_HKDF_MODE:
      if (p1 != EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND &&
          p1 != EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY &&
          p1 != EVP_PKEY_HKDEF_MODE_EXPAND_ONLY) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_OPERATION);
        return 0;
      }
      hctx->mode = p1;
      return 1;
    case EVP_PKEY_CTRL_HKDF_MD:
      hctx->md = reinterpret_cast<const EVP_MD *>(p2);
      return 1;
    case EVP_PKEY_CTRL_HKDF_KEY: {
      const CBS *key = reinterpret_cast<const CBS *>(p2);
      if (!CBS_stow(key, &hctx->key, &hctx->key_len)) {
        return 0;
      }
      return 1;
    }
    case EVP_PKEY_CTRL_HKDF_SALT: {
      const CBS *salt = reinterpret_cast<const CBS *>(p2);
      if (!CBS_stow(salt, &hctx->salt, &hctx->salt_len)) {
        return 0;
      }
      return 1;
    }
    case EVP_PKEY_CTRL_HKDF_INFO: {
      const CBS *info = reinterpret_cast<const CBS *>(p2);
      // |EVP_PKEY_CTX_add1_hkdf_info| appends to the info string, rather than
      // replacing it.
      if (!CBB_add_bytes(&hctx->info, CBS_data(info), CBS_len(info))) {
        return 0;
      }
      return 1;
    }
    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}